

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film_grain_table_test.cc
# Opt level: O0

void __thiscall
FilmGrainTableTest_AddAndLookupSingleSegment_Test::TestBody
          (FilmGrainTableTest_AddAndLookupSingleSegment_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  int iVar4;
  int iVar5;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__7;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  aom_film_grain_t grain;
  aom_film_grain_table_t table;
  bool *in_stack_fffffffffffff988;
  aom_film_grain_table_entry_t *in_stack_fffffffffffff990;
  aom_film_grain_table_entry_t *rhs;
  undefined7 in_stack_fffffffffffff998;
  undefined1 in_stack_fffffffffffff99f;
  char *in_stack_fffffffffffff9a0;
  char *in_stack_fffffffffffff9a8;
  AssertionResult *pAVar6;
  undefined4 in_stack_fffffffffffff9b0;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffff9b4;
  undefined4 uVar8;
  aom_film_grain_t *in_stack_fffffffffffff9b8;
  AssertionResult *pAVar9;
  Type type;
  undefined4 in_stack_fffffffffffff9c0;
  int in_stack_fffffffffffff9c4;
  int64_t in_stack_fffffffffffff9c8;
  uint in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d4;
  undefined4 uVar10;
  aom_film_grain_table_t *in_stack_fffffffffffff9d8;
  aom_film_grain_table_t *t;
  undefined7 in_stack_fffffffffffff9f0;
  undefined1 in_stack_fffffffffffff9f7;
  char *in_stack_fffffffffffff9f8;
  char *in_stack_fffffffffffffa00;
  undefined7 in_stack_fffffffffffffa08;
  undefined1 in_stack_fffffffffffffa0f;
  AssertHelper *in_stack_fffffffffffffa10;
  undefined1 local_568 [48];
  string local_538 [55];
  undefined1 local_501;
  AssertionResult local_500;
  string local_4f0 [52];
  int local_4bc;
  AssertionResult local_4b8;
  string local_4a8 [55];
  undefined1 local_471;
  aom_film_grain_table_t local_470;
  string local_460 [52];
  int local_42c;
  AssertionResult local_428 [2];
  AssertionResult local_408 [2];
  int local_3e8;
  int local_3e4;
  AssertionResult local_3e0;
  string local_3d0 [52];
  int local_39c;
  AssertionResult local_398;
  string local_388 [55];
  undefined1 local_351;
  AssertionResult local_350;
  string local_340 [55];
  undefined1 local_309;
  AssertionResult local_308;
  string local_2f8 [71];
  undefined1 local_2b1;
  AssertionResult local_2b0;
  undefined1 local_2a0 [632];
  uint local_28;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_18 = 0;
  uStack_10 = 0;
  iVar4 = aom_film_grain_table_lookup
                    (in_stack_fffffffffffff9d8,
                     CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                     in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c4,in_stack_fffffffffffff9b8);
  local_2b1 = iVar4 == 0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff990,in_stack_fffffffffffff988,(type *)0x55ab2f
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2b0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa08),
               in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
               (char *)CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
               (Type)((ulong)in_stack_fffffffffffff9b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
               (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20),in_stack_fffffffffffff9a0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffa10,
               (Message *)CONCAT17(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa08));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff990);
    std::__cxx11::string::~string(local_2f8);
    testing::Message::~Message((Message *)0x55ac19);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x55ac94);
  aom_film_grain_table_append
            ((aom_film_grain_table_t *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0)
             ,(int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0,
             (aom_film_grain_t *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998));
  iVar4 = aom_film_grain_table_lookup
                    (in_stack_fffffffffffff9d8,
                     CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                     in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c4,in_stack_fffffffffffff9b8);
  local_309 = iVar4 == 0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff990,in_stack_fffffffffffff988,(type *)0x55ad1a
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_308);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa08),
               in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
               (char *)CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
               (Type)((ulong)in_stack_fffffffffffff9b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
               (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20),in_stack_fffffffffffff9a0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffa10,
               (Message *)CONCAT17(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa08));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff990);
    std::__cxx11::string::~string(local_340);
    testing::Message::~Message((Message *)0x55ae16);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x55ae91);
  iVar4 = aom_film_grain_table_lookup
                    (in_stack_fffffffffffff9d8,
                     CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                     in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c4,in_stack_fffffffffffff9b8);
  local_351 = iVar4 == 0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff990,in_stack_fffffffffffff988,(type *)0x55aeeb
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_350);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa08),
               in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
               (char *)CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
               (Type)((ulong)in_stack_fffffffffffff9b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
               (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20),in_stack_fffffffffffff9a0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffa10,
               (Message *)CONCAT17(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa08));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff990);
    std::__cxx11::string::~string(local_388);
    testing::Message::~Message((Message *)0x55afe7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x55b062);
  local_39c = aom_film_grain_table_lookup
                        (in_stack_fffffffffffff9d8,
                         CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                         in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c4,
                         in_stack_fffffffffffff9b8);
  testing::AssertionResult::AssertionResult<int>
            ((AssertionResult *)in_stack_fffffffffffff990,(int *)in_stack_fffffffffffff988,
             (type *)0x55b0b9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_398);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa08),
               in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
               (char *)CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
               (Type)((ulong)in_stack_fffffffffffff9b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
               (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20),in_stack_fffffffffffff9a0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffa10,
               (Message *)CONCAT17(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa08));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff990);
    std::__cxx11::string::~string(local_3d0);
    testing::Message::~Message((Message *)0x55b1b5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x55b230);
  local_28 = film_grain_test_vectors[0].bit_depth;
  local_3e4 = 0;
  local_3e8 = memcmp(local_2a0,film_grain_test_vectors,0x10);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
             (int *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
             (int *)in_stack_fffffffffffff990);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3e0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
    in_stack_fffffffffffffa10 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x55b30a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
               (Type)((ulong)in_stack_fffffffffffff9b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
               (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20),in_stack_fffffffffffff9a0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffa10,
               (Message *)CONCAT17(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa08));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff990);
    testing::Message::~Message((Message *)0x55b36d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x55b3c5);
  aom_film_grain_table_append
            ((aom_film_grain_table_t *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0)
             ,(int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0,
             (aom_film_grain_t *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998));
  pAVar6 = local_408;
  testing::internal::EqHelper::Compare<aom_film_grain_table_entry_t>
            (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
             (nullptr_t)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
             in_stack_fffffffffffff990);
  iVar4 = (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar6);
  if (!(bool)uVar2) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
    in_stack_fffffffffffff9f8 =
         testing::AssertionResult::failure_message((AssertionResult *)0x55b482);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
               (Type)((ulong)in_stack_fffffffffffff9b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),iVar4,
               in_stack_fffffffffffff9a0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffa10,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffa08));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff990);
    testing::Message::~Message((Message *)0x55b4df);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x55b534);
  local_42c = aom_film_grain_table_lookup
                        (in_stack_fffffffffffff9d8,
                         CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                         in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c4,
                         in_stack_fffffffffffff9b8);
  testing::AssertionResult::AssertionResult<int>
            ((AssertionResult *)in_stack_fffffffffffff990,(int *)in_stack_fffffffffffff988,
             (type *)0x55b57d);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(local_428);
  if (!(bool)uVar3) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(uVar2,in_stack_fffffffffffffa08),&pAVar6->success_,
               in_stack_fffffffffffff9f8,(char *)CONCAT17(uVar3,in_stack_fffffffffffff9f0));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
               (Type)((ulong)in_stack_fffffffffffff9b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),iVar4,
               in_stack_fffffffffffff9a0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffa10,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffa08));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff990);
    std::__cxx11::string::~string(local_460);
    testing::Message::~Message((Message *)0x55b670);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x55b6e8);
  uVar10 = 0;
  iVar5 = aom_film_grain_table_lookup
                    (in_stack_fffffffffffff9d8,(ulong)in_stack_fffffffffffff9d0,
                     in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c4,in_stack_fffffffffffff9b8);
  local_471 = iVar5 == 0;
  t = &local_470;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff990,in_stack_fffffffffffff988,(type *)0x55b739
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)t);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(uVar2,in_stack_fffffffffffffa08),&pAVar6->success_,
               in_stack_fffffffffffff9f8,(char *)CONCAT17(uVar3,in_stack_fffffffffffff9f0));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
               (Type)((ulong)in_stack_fffffffffffff9b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),iVar4,
               in_stack_fffffffffffff9a0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffa10,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffa08));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff990);
    std::__cxx11::string::~string(local_4a8);
    testing::Message::~Message((Message *)0x55b82c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x55b8a4);
  local_4bc = aom_film_grain_table_lookup
                        (t,CONCAT44(uVar10,in_stack_fffffffffffff9d0),in_stack_fffffffffffff9c8,
                         in_stack_fffffffffffff9c4,in_stack_fffffffffffff9b8);
  pAVar9 = &local_4b8;
  testing::AssertionResult::AssertionResult<int>
            ((AssertionResult *)in_stack_fffffffffffff990,(int *)in_stack_fffffffffffff988,
             (type *)0x55b8ed);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar9);
  uVar7 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff9d0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(uVar2,in_stack_fffffffffffffa08),&pAVar6->success_,
               in_stack_fffffffffffff9f8,(char *)CONCAT17(uVar3,in_stack_fffffffffffff9f0));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
               (Type)((ulong)in_stack_fffffffffffff9b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),iVar4,
               in_stack_fffffffffffff9a0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffa10,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffa08));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff990);
    std::__cxx11::string::~string(local_4f0);
    testing::Message::~Message((Message *)0x55b9e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x55ba58);
  uVar8 = 0;
  iVar5 = aom_film_grain_table_lookup
                    (t,CONCAT44(uVar10,uVar7),(int64_t)pAVar9,in_stack_fffffffffffff9c4,
                     in_stack_fffffffffffff9b8);
  local_501 = iVar5 == 0;
  pAVar9 = &local_500;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff990,in_stack_fffffffffffff988,(type *)0x55baa9
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar9);
  type = (Type)((ulong)pAVar9 >> 0x20);
  uVar10 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff9c4);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(uVar10,in_stack_fffffffffffff9c0));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(uVar2,in_stack_fffffffffffffa08),&pAVar6->success_,
               in_stack_fffffffffffff9f8,(char *)CONCAT17(uVar3,in_stack_fffffffffffff9f0));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(uVar10,in_stack_fffffffffffff9c0),type,
               (char *)CONCAT44(uVar8,in_stack_fffffffffffff9b0),iVar4,in_stack_fffffffffffff9a0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffa10,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffa08));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff990);
    std::__cxx11::string::~string(local_538);
    testing::Message::~Message((Message *)0x55bb9c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x55bc14);
  pAVar6 = (AssertionResult *)(local_568 + 0x20);
  testing::internal::EqHelper::Compare<aom_film_grain_table_entry_t>
            ((char *)pAVar6,in_stack_fffffffffffff9a0,
             (nullptr_t)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
             in_stack_fffffffffffff990);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar6);
  uVar7 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff9b0);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(uVar10,in_stack_fffffffffffff9c0));
    in_stack_fffffffffffff9a0 =
         testing::AssertionResult::failure_message((AssertionResult *)0x55bca6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(uVar10,in_stack_fffffffffffff9c0),type,
               (char *)CONCAT44(uVar8,uVar7),(int)((ulong)pAVar6 >> 0x20),in_stack_fffffffffffff9a0)
    ;
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffa10,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffa08));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff990);
    testing::Message::~Message((Message *)0x55bd03);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x55bd58);
  rhs = (aom_film_grain_table_entry_t *)local_568;
  testing::internal::EqHelper::Compare<aom_film_grain_table_entry_t>
            (&pAVar6->success_,in_stack_fffffffffffff9a0,
             (nullptr_t)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),rhs);
  iVar4 = (int)((ulong)pAVar6 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)rhs);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(uVar10,in_stack_fffffffffffff9c0));
    testing::AssertionResult::failure_message((AssertionResult *)0x55bdea);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(uVar10,in_stack_fffffffffffff9c0),type,
               (char *)CONCAT44(uVar8,uVar7),iVar4,in_stack_fffffffffffff9a0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffa10,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffa08));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)rhs);
    testing::Message::~Message((Message *)0x55be45);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x55be9a);
  aom_film_grain_table_free((aom_film_grain_table_t *)rhs);
  return;
}

Assistant:

TEST(FilmGrainTableTest, AddAndLookupSingleSegment) {
  aom_film_grain_table_t table;
  memset(&table, 0, sizeof(table));

  aom_film_grain_t grain;
  EXPECT_FALSE(aom_film_grain_table_lookup(&table, 0, 1000, false, &grain));

  aom_film_grain_table_append(&table, 1000, 2000, film_grain_test_vectors + 0);
  EXPECT_FALSE(aom_film_grain_table_lookup(&table, 0, 1000, false, &grain));
  EXPECT_FALSE(aom_film_grain_table_lookup(&table, 2000, 3000, false, &grain));

  EXPECT_TRUE(aom_film_grain_table_lookup(&table, 1000, 2000, false, &grain));

  grain.bit_depth = film_grain_test_vectors[0].bit_depth;
  EXPECT_EQ(0, memcmp(&grain, film_grain_test_vectors + 0, sizeof(table)));

  // Extend the existing segment
  aom_film_grain_table_append(&table, 2000, 3000, film_grain_test_vectors + 0);
  EXPECT_EQ(nullptr, table.head->next);

  // Lookup and remove and check that the entry is no longer there
  EXPECT_TRUE(aom_film_grain_table_lookup(&table, 1000, 2000, true, &grain));
  EXPECT_FALSE(aom_film_grain_table_lookup(&table, 1000, 2000, false, &grain));

  EXPECT_TRUE(aom_film_grain_table_lookup(&table, 2000, 3000, true, &grain));
  EXPECT_FALSE(aom_film_grain_table_lookup(&table, 2000, 3000, false, &grain));

  EXPECT_EQ(nullptr, table.head);
  EXPECT_EQ(nullptr, table.tail);
  aom_film_grain_table_free(&table);
}